

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadingInstance.cpp
# Opt level: O2

void __thiscall LoadingInstance::Build(LoadingInstance *this,Instance *instance)

{
  pointer pTVar1;
  istream *this_00;
  int i;
  int iVar2;
  int val;
  int numerOfTaks;
  int local_38;
  int local_34;
  Task local_30;
  
  this_00 = (istream *)std::istream::operator>>((istream *)this->in,&instance->numProcessors);
  std::istream::operator>>(this_00,&local_34);
  pTVar1 = (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar1 != (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar1;
  }
  local_38 = 0;
  for (iVar2 = 0; iVar2 < local_34; iVar2 = iVar2 + 1) {
    std::istream::operator>>((istream *)this->in,&local_38);
    local_30.length = local_38;
    local_30.id = iVar2;
    std::vector<Task,_std::allocator<Task>_>::emplace_back<Task>(&instance->tasks,&local_30);
  }
  return;
}

Assistant:

void LoadingInstance::Build(Instance& instance){
	int numerOfTaks;
	(*in) >> instance.numProcessors >> numerOfTaks;
	if(!instance.tasks.empty()) instance.tasks.clear();
	//if previous Instance was already built, replace it's old content

	int val = 0;
	for(int i = 0; i < numerOfTaks; i++){
		(*in) >> val;
		instance.tasks.push_back(Task(val, i));
	}
}